

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O1

void duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>::
     Finalize<double,duckdb::KurtosisState>
               (KurtosisState *state,double *target,AggregateFinalizeData *finalize_data)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  char cVar4;
  OutOfRangeException *this;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double __x;
  double dVar10;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar3 = state->n;
  if (1 < uVar3) {
    auVar7._8_4_ = (int)(uVar3 >> 0x20);
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = 0x45300000;
    __x = 1.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    dVar10 = state->sum;
    dVar1 = state->sum_sqr;
    dVar9 = dVar1 - dVar10 * dVar10 * __x;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar9 = dVar1 - dVar10 * dVar10 * __x;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        dVar9 = state->sum_cub;
        dVar2 = state->sum_four;
        dVar5 = pow(dVar10,4.0);
        dVar6 = pow(__x,3.0);
        dVar8 = (state->sum_sqr - state->sum * state->sum * __x) * __x;
        if (0.0 < dVar8) {
          dVar10 = ((dVar5 * -3.0 * dVar6 +
                    dVar1 * 6.0 * dVar10 * dVar10 * __x * __x + dVar9 * -4.0 * dVar10 * __x + dVar2)
                   * __x) / (dVar8 * dVar8) + -3.0;
          *target = dVar10;
          cVar4 = duckdb::Value::DoubleIsFinite(dVar10);
          if (cVar4 != '\0') {
            return;
          }
          this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_40[0] = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_40,"Kurtosis is out of range!","");
          duckdb::OutOfRangeException::OutOfRangeException(this,(string *)local_40);
          __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		auto n = (double)state.n;
		if (n <= 1) {
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagBiasCorrection>::value && n <= 3) {
			finalize_data.ReturnNull();
			return;
		}
		double temp = 1 / n;
		//! This is necessary due to linux 32 bits
		long double temp_aux = 1 / n;
		if (state.sum_sqr - state.sum * state.sum * temp == 0 ||
		    state.sum_sqr - state.sum * state.sum * temp_aux == 0) {
			finalize_data.ReturnNull();
			return;
		}
		double m4 =
		    temp * (state.sum_four - 4 * state.sum_cub * state.sum * temp +
		            6 * state.sum_sqr * state.sum * state.sum * temp * temp - 3 * pow(state.sum, 4) * pow(temp, 3));

		double m2 = temp * (state.sum_sqr - state.sum * state.sum * temp);
		if (m2 <= 0) { // m2 shouldn't be below 0 but floating points are weird
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagNoBiasCorrection>::value) {
			target = m4 / (m2 * m2) - 3;
		} else {
			target = (n - 1) * ((n + 1) * m4 / (m2 * m2) - 3 * (n - 1)) / ((n - 2) * (n - 3));
		}
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("Kurtosis is out of range!");
		}
	}